

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[27],char_const*,char[10],std::__cxx11::string,char[8],int,char[3],char_const*>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [27],char **Args_1,
          char (*Args_2) [10],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_3,
          char (*Args_4) [8],int *Args_5,char (*Args_6) [3],char **Args_7)

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[27],char_const*,char[10],std::__cxx11::string,char[8],int,char[3],char_const*>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [27])this,(char **)Args,(char (*) [10])Args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_2,
             (char (*) [8])Args_3,(int *)Args_4,(char (*) [3])Args_5,(char **)Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}